

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listTest.cpp
# Opt level: O1

void print<std::__cxx11::list<double,std::allocator<double>>>
               (list<double,_std::allocator<double>_> *t,char *s)

{
  long lVar1;
  undefined8 in_RAX;
  size_t sVar2;
  _List_node_base *p_Var3;
  undefined8 uStack_38;
  
  lVar1 = std::cout;
  *(undefined8 *)(tolower + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar1 + -0x18) + 0x10f0c0);
  }
  else {
    sVar2 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  p_Var3 = (t->super__List_base<double,_std::allocator<double>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)t) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      std::ostream::_M_insert<double>((double)p_Var3[1]._M_next);
      p_Var3 = (((_List_base<double,_std::allocator<double>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)t);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T const & t, char const * s) {
	typename T::const_iterator	it;

	std::cout << std::setw(3) << s << " contains:";
	for (it = t.begin(); it != t.end(); ++it)
		std::cout << ' ' << *it;
	std::cout << std::endl;
}